

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::Hasher<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::equal_to<const_slang::ast::Symbol_*>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>_>::templated_iterator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,slang::ast::Symbol_const*,slang::Hasher<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,slang::Hasher<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,std::equal_to<slang::ast::Symbol_const*>>,std::allocator<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>>
::
emplace_new_key<slang::ast::AssertionPortSymbol_const*&,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
          (sherwood_v3_table<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,slang::ast::Symbol_const*,slang::Hasher<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,slang::Hasher<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,std::equal_to<slang::ast::Symbol_const*>>,std::allocator<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,AssertionPortSymbol **key,
          tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *args)

{
  long lVar1;
  tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *ptVar2;
  long lVar3;
  AssertionPortSymbol *pAVar4;
  AssertionInstanceDetails *pAVar5;
  PropertyExprSyntax *pPVar6;
  Symbol *pSVar7;
  not_null<const_slang::ast::Scope_*> nVar8;
  underlying_type uVar9;
  TempVarSymbol *pTVar10;
  RandomizeDetails *pRVar11;
  undefined8 uVar12;
  Symbol *pSVar13;
  undefined8 uVar14;
  _Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *p_Var15;
  SymbolIndex SVar16;
  undefined4 uVar17;
  char cVar18;
  long lVar19;
  ulong uVar20;
  EntryPointer psVar22;
  size_t sVar23;
  EntryPointer psVar24;
  PropertyExprSyntax *pPVar25;
  Symbol *__tmp_4;
  Symbol *pSVar26;
  undefined4 in_R10D;
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::Hasher<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::equal_to<const_slang::ast::Symbol_*>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>_>::templated_iterator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_bool>
  pVar30;
  undefined1 auVar31 [16];
  ASTContext __tmp_2;
  pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>
  local_60;
  undefined1 auVar32 [16];
  undefined7 uVar21;
  
  lVar3 = *(long *)(this + 8);
  if ((lVar3 != 0) &&
     (this[0x11] !=
      (sherwood_v3_table<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,slang::ast::Symbol_const*,slang::Hasher<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,slang::Hasher<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,std::equal_to<slang::ast::Symbol_const*>>,std::allocator<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>>
       )distance_from_desired)) {
    lVar19 = *(long *)(this + 0x18) + 1;
    auVar28._8_4_ = (int)((ulong)lVar19 >> 0x20);
    auVar28._0_8_ = lVar19;
    auVar28._12_4_ = 0x45300000;
    lVar1 = lVar3 + 1;
    auVar29._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar29._0_8_ = lVar1;
    auVar29._12_4_ = 0x45300000;
    if ((auVar28._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x14) *
        ((auVar29._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) {
      cVar18 = current_entry->distance_from_desired;
      uVar21 = (undefined7)((ulong)lVar1 >> 8);
      uVar20 = CONCAT71(uVar21,cVar18);
      if (cVar18 < '\0') {
        (current_entry->field_1).value.first = &(*key)->super_Symbol;
        SVar16 = (args->
                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                 ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
        uVar17 = *(undefined4 *)
                  &(args->
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc;
        uVar9 = (args->
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
        pSVar26 = (args->
                  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                  ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
        pTVar10 = (args->
                  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                  ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
        pRVar11 = (args->
                  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                  ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails
        ;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr =
             (args->
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
        p_Var15 = &(current_entry->field_1).value.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
        ;
        (p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex = SVar16;
        *(undefined4 *)
         &(p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
          super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc = uVar17;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits = uVar9;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc = pSVar26;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar = pTVar10;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails = pRVar11
        ;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance =
             (args->
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl =
             (args->
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             ).super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl;
        current_entry->distance_from_desired = distance_from_desired;
      }
      else {
        pAVar4 = *key;
        nVar8.ptr = (args->
                    super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                    ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                    super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
        SVar16 = (args->
                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                 ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
        uVar17 = *(undefined4 *)
                  &(args->
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc;
        uVar9 = (args->
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
        pSVar7 = (args->
                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                 ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
        pTVar10 = (args->
                  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                  ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
        pRVar11 = (args->
                  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                  ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails
        ;
        pAVar5 = (args->
                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                 ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance
        ;
        pPVar6 = (args->
                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                 ).super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>.
                 _M_head_impl;
        current_entry->distance_from_desired = distance_from_desired;
        pSVar26 = (current_entry->field_1).value.first;
        (current_entry->field_1).value.first = &pAVar4->super_Symbol;
        pPVar25 = (current_entry->field_1).value.second.
                  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                  .super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>.
                  _M_head_impl;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl =
             pPVar6;
        local_60.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance =
             (current_entry->field_1).value.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance;
        local_60.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr =
             (current_entry->field_1).value.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
        p_Var15 = &(current_entry->field_1).value.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
        ;
        local_60.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex =
             (p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
        local_60.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl._12_4_ =
             *(undefined4 *)
              &(p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc;
        local_60.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits =
             (current_entry->field_1).value.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
        local_60.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc =
             (current_entry->field_1).value.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
        local_60.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar =
             (current_entry->field_1).value.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
        local_60.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails =
             (current_entry->field_1).value.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance = pAVar5
        ;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar = pTVar10;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails = pRVar11
        ;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits = uVar9;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc = pSVar7;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr = nVar8.ptr;
        p_Var15 = &(current_entry->field_1).value.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
        ;
        (p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex = SVar16;
        *(undefined4 *)
         &(p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
          super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc = uVar17;
        uVar20 = CONCAT71(uVar21,cVar18 + '\x01');
        psVar22 = current_entry + 1;
        uVar27 = CONCAT31((int3)((uint)in_R10D >> 8),current_entry[1].distance_from_desired);
        psVar24 = current_entry;
        if (-1 < current_entry[1].distance_from_desired) {
          ptVar2 = &(current_entry->field_1).value.second;
          do {
            psVar24 = psVar22;
            cVar18 = (char)uVar20;
            if ((char)uVar27 < cVar18) {
              psVar24->distance_from_desired = cVar18;
              pSVar7 = (psVar24->field_1).value.first;
              pPVar6 = (psVar24->field_1).value.second.
                       super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                       .super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>.
                       _M_head_impl;
              (psVar24->field_1).value.first = pSVar26;
              (psVar24->field_1).value.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl
                   = pPVar25;
              pAVar5 = (psVar24->field_1).value.second.
                       super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                       .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                       super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                       assertionInstance;
              nVar8.ptr = (psVar24->field_1).value.second.
                          super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                          .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                          super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.
                          ptr;
              p_Var15 = &(psVar24->field_1).value.second.
                         super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              ;
              uVar12._0_4_ = (p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                             lookupIndex;
              uVar12._4_4_ = *(undefined4 *)
                              &(p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                               field_0xc;
              uVar9 = (psVar24->field_1).value.second.
                      super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                      .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                      super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits
              ;
              pSVar13 = (psVar24->field_1).value.second.
                        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                        .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                        instanceOrProc;
              pTVar10 = (psVar24->field_1).value.second.
                        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                        .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                        firstTempVar;
              pRVar11 = (psVar24->field_1).value.second.
                        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                        .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                        randomizeDetails;
              (psVar24->field_1).value.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance =
                   local_60.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                   assertionInstance;
              (psVar24->field_1).value.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar =
                   local_60.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
              (psVar24->field_1).value.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails =
                   local_60.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                   randomizeDetails;
              (psVar24->field_1).value.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits =
                   local_60.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
              (psVar24->field_1).value.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc =
                   local_60.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
              (psVar24->field_1).value.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr =
                   local_60.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
              p_Var15 = &(psVar24->field_1).value.second.
                         super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              ;
              (p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex =
                   local_60.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
              *(undefined4 *)
               &(p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc =
                   local_60.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl._12_4_;
              uVar27 = CONCAT31((int3)(uVar27 >> 8),(char)uVar27 + '\x01');
              uVar20 = (ulong)uVar27;
              pPVar25 = pPVar6;
              pSVar26 = pSVar7;
              local_60.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr =
                   nVar8.ptr;
              local_60.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl._8_8_ = uVar12;
              local_60.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits = uVar9
              ;
              local_60.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc =
                   pSVar13;
              local_60.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar =
                   pTVar10;
              local_60.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails =
                   pRVar11;
              local_60.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance =
                   pAVar5;
            }
            else {
              uVar20 = CONCAT71((int7)(uVar20 >> 8),cVar18 + '\x01');
              if ((sherwood_v3_table<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,slang::ast::Symbol_const*,slang::Hasher<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,slang::Hasher<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,std::equal_to<slang::ast::Symbol_const*>>,std::allocator<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>>
                   )(cVar18 + '\x01') == this[0x11]) {
                local_60.first = (current_entry->field_1).value.first;
                (current_entry->field_1).value.first = pSVar26;
                local_60.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>.
                _M_head_impl = (current_entry->field_1).value.second.
                               super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                               .
                               super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>
                               ._M_head_impl;
                (current_entry->field_1).value.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>.
                _M_head_impl = pPVar25;
                pAVar5 = (current_entry->field_1).value.second.
                         super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                         .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                         super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                         assertionInstance;
                nVar8.ptr = (ptVar2->
                            super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                            ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                            super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.
                            ptr;
                p_Var15 = &(current_entry->field_1).value.second.
                           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                ;
                uVar14._0_4_ = (p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                               lookupIndex;
                uVar14._4_4_ = *(undefined4 *)
                                &(p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                                 field_0xc;
                uVar9 = (current_entry->field_1).value.second.
                        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                        .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.
                        m_bits;
                pSVar26 = (current_entry->field_1).value.second.
                          super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                          .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                          super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                          instanceOrProc;
                pTVar10 = (current_entry->field_1).value.second.
                          super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                          .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                          super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                          firstTempVar;
                pRVar11 = (current_entry->field_1).value.second.
                          super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                          .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                          super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                          randomizeDetails;
                (current_entry->field_1).value.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance
                     = local_60.second.
                       super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                       .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                       super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                       assertionInstance;
                (current_entry->field_1).value.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar =
                     local_60.second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
                (current_entry->field_1).value.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails =
                     local_60.second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                     randomizeDetails;
                (current_entry->field_1).value.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits =
                     local_60.second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
                (current_entry->field_1).value.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc =
                     local_60.second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                     instanceOrProc;
                (ptVar2->
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr =
                     local_60.second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
                p_Var15 = &(current_entry->field_1).value.second.
                           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                ;
                (p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex =
                     local_60.second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
                *(undefined4 *)
                 &(p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc =
                     local_60.second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl._12_4_;
                uVar20 = *(long *)(this + 8) * 2 + 2;
                sVar23 = 4;
                if (4 < uVar20) {
                  sVar23 = uVar20;
                }
                local_60.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr =
                     nVar8.ptr;
                local_60.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl._8_8_ = uVar14;
                local_60.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits =
                     uVar9;
                local_60.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc =
                     pSVar26;
                local_60.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar =
                     pTVar10;
                local_60.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails =
                     pRVar11;
                local_60.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance
                     = pAVar5;
                sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::Hasher<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::equal_to<const_slang::ast::Symbol_*>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>_>
                ::rehash((sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::Hasher<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::equal_to<const_slang::ast::Symbol_*>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>_>
                          *)this,sVar23);
                pVar30 = emplace<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>
                                   (this,&local_60);
                auVar31._0_8_ = pVar30.first.current;
                auVar31[8] = pVar30.second;
                auVar31._9_7_ = pVar30._9_7_;
                return (pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::Hasher<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::equal_to<const_slang::ast::Symbol_*>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>_>::templated_iterator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_bool>
                        )auVar31;
              }
            }
            uVar27 = CONCAT31((int3)(uVar27 >> 8),psVar24[1].distance_from_desired);
            psVar22 = psVar24 + 1;
          } while (-1 < psVar24[1].distance_from_desired);
        }
        psVar24[1].field_1.value.first = pSVar26;
        psVar24[1].field_1.value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr =
             local_60.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
        p_Var15 = &psVar24[1].field_1.value.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
        ;
        (p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex =
             local_60.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
        *(undefined4 *)
         &(p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
          super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc =
             local_60.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl._12_4_;
        psVar24[1].field_1.value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits =
             local_60.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
        psVar24[1].field_1.value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc =
             local_60.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
        psVar24[1].field_1.value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar =
             local_60.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
        psVar24[1].field_1.value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails =
             local_60.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails;
        psVar24[1].field_1.value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance =
             local_60.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance;
        psVar24[1].field_1.value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl =
             pPVar25;
        psVar22->distance_from_desired = (int8_t)uVar20;
      }
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
      auVar32._0_8_ = current_entry;
      auVar32[8] = 1;
      auVar32._9_7_ = (int7)(uVar20 >> 8);
      return (pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::Hasher<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::equal_to<const_slang::ast::Symbol_*>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>_>::templated_iterator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_bool>
              )auVar32;
    }
  }
  uVar20 = lVar3 * 2 + 2;
  sVar23 = 4;
  if (4 < uVar20) {
    sVar23 = uVar20;
  }
  sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::Hasher<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::equal_to<const_slang::ast::Symbol_*>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>_>
  ::rehash((sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::Hasher<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::equal_to<const_slang::ast::Symbol_*>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>_>
            *)this,sVar23);
  pVar30 = emplace<slang::ast::AssertionPortSymbol_const*&,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                     (this,key,args);
  return pVar30;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }